

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::printHeaderString(ConsoleReporter *this,string *_string,size_t indent)

{
  size_type sVar1;
  Column *pCVar2;
  ostream *poVar3;
  Column local_58;
  long local_28;
  size_t i;
  size_t indent_local;
  string *_string_local;
  ConsoleReporter *this_local;
  
  i = indent;
  indent_local = (size_t)_string;
  _string_local = (string *)this;
  sVar1 = clara::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          find(_string,": ",0);
  if (sVar1 == 0xffffffffffffffff) {
    local_28 = 0;
  }
  else {
    local_28 = sVar1 + 2;
  }
  poVar3 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  clara::TextFlow::Column::Column(&local_58,(string *)indent_local);
  pCVar2 = clara::TextFlow::Column::indent(&local_58,i + local_28);
  pCVar2 = clara::TextFlow::Column::initialIndent(pCVar2,i);
  poVar3 = clara::TextFlow::operator<<(poVar3,pCVar2);
  std::operator<<((ostream *)poVar3,'\n');
  clara::TextFlow::Column::~Column(&local_58);
  return;
}

Assistant:

void ConsoleReporter::printHeaderString(std::string const& _string, std::size_t indent) {
    std::size_t i = _string.find(": ");
    if (i != std::string::npos)
        i += 2;
    else
        i = 0;
    stream << Column(_string).indent(indent + i).initialIndent(indent) << '\n';
}